

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

int __thiscall soplex::SPxDantzigPR<double>::selectLeave(SPxDantzigPR<double> *this)

{
  double dVar1;
  double *pdVar2;
  SPxDantzigPR<double> *in_RDI;
  double x;
  int i;
  int n;
  double best;
  int in_stack_ffffffffffffffcc;
  int local_20;
  int local_1c;
  double local_18;
  int local_4;
  
  if ((((in_RDI->super_SPxPricer<double>).thesolver)->sparsePricingLeave & 1U) == 0) {
    dVar1 = (in_RDI->super_SPxPricer<double>).thetolerance;
    local_1c = -1;
    local_20 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e84eb);
    local_18 = -dVar1;
    while (local_20 = local_20 + -1, -1 < local_20) {
      SPxSolverBase<double>::fTest((in_RDI->super_SPxPricer<double>).thesolver);
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffcc);
      dVar1 = *pdVar2;
      if ((dVar1 < -(in_RDI->super_SPxPricer<double>).thetolerance) && (dVar1 < local_18)) {
        local_1c = local_20;
        local_18 = dVar1;
      }
    }
    local_4 = local_1c;
  }
  else {
    local_4 = selectLeaveSparse(in_RDI);
  }
  return local_4;
}

Assistant:

int SPxDantzigPR<R>::selectLeave()
{
   assert(this->thesolver != nullptr);

   if(this->thesolver->sparsePricingLeave)
      return selectLeaveSparse();

   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   R best = -this->thetolerance;
   int  n    = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      R x = this->thesolver->fTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = i;
            best = x;
         }
      }
   }

   return n;
}